

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

int Disconnectubloxx(UBLOX *publox)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if ((UBLOX *)addrsublox[lVar2] == publox) {
      iVar1 = Disconnectublox(publox);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsublox[lVar2] = (void *)0x0;
      return 0;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int Disconnectubloxx(UBLOX* publox)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsublox[id] != publox)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = Disconnectublox(publox);
	if (res != EXIT_SUCCESS) return res;

	addrsublox[id] = NULL;

	return EXIT_SUCCESS;
}